

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

bool DiffDistTest2<unsigned_long,unsigned_long>(pfHash hash,bool drawDiagram)

{
  pointer puVar1;
  bool bVar2;
  int keybit;
  uint bit;
  bool bVar3;
  int i;
  long lVar4;
  unsigned_long h2;
  unsigned_long h1;
  unsigned_long k;
  ulong local_70;
  ulong local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  Rand local_48;
  undefined1 local_38 [8];
  
  local_48.x = 0x407129e7;
  local_48.y = 0x7888093c;
  local_48.z = 0x760425e2;
  local_48.w = 0x898677b9;
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x1000000);
  puVar1 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 0x200000;
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1;
  memset(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x1000000);
  bVar3 = true;
  bit = 0;
  local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  do {
    printf("Testing bit %d\n",(ulong)bit);
    lVar4 = 0;
    do {
      Rand::rand_p(&local_48,local_38,8);
      (*hash)(local_38,8,0,&local_68);
      flipbit(local_38,8,bit);
      (*hash)(local_38,8,0,&local_70);
      local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = local_70 ^ local_68;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x200000);
    bVar2 = TestHashList<unsigned_long>(&local_60,true,true,drawDiagram,true,true);
    bVar3 = (bool)(bVar3 & bVar2);
    putchar(10);
    bit = bit + 1;
  } while (bit != 0x40);
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}